

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gameworld.cpp
# Opt level: O1

void __thiscall CGameWorld::RemoveEntity(CGameWorld *this,CEntity *pEnt)

{
  CEntity *pCVar1;
  CEntity **ppCVar2;
  
  if (((pEnt->m_pNextTypeEntity != (CEntity *)0x0) || (pEnt->m_pPrevTypeEntity != (CEntity *)0x0))
     || (this->m_apFirstEntityTypes[pEnt->m_ObjType] == pEnt)) {
    if (pEnt->m_pPrevTypeEntity == (CEntity *)0x0) {
      ppCVar2 = this->m_apFirstEntityTypes + pEnt->m_ObjType;
    }
    else {
      ppCVar2 = &pEnt->m_pPrevTypeEntity->m_pNextTypeEntity;
    }
    *ppCVar2 = pEnt->m_pNextTypeEntity;
    pCVar1 = pEnt->m_pNextTypeEntity;
    if (pCVar1 != (CEntity *)0x0) {
      pCVar1->m_pPrevTypeEntity = pEnt->m_pPrevTypeEntity;
    }
    if (this->m_pNextTraverseEntity == pEnt) {
      this->m_pNextTraverseEntity = pCVar1;
    }
    pEnt->m_pPrevTypeEntity = (CEntity *)0x0;
    pEnt->m_pNextTypeEntity = (CEntity *)0x0;
  }
  return;
}

Assistant:

void CGameWorld::RemoveEntity(CEntity *pEnt)
{
	// not in the list
	if(!pEnt->m_pNextTypeEntity && !pEnt->m_pPrevTypeEntity && m_apFirstEntityTypes[pEnt->m_ObjType] != pEnt)
		return;

	// remove
	if(pEnt->m_pPrevTypeEntity)
		pEnt->m_pPrevTypeEntity->m_pNextTypeEntity = pEnt->m_pNextTypeEntity;
	else
		m_apFirstEntityTypes[pEnt->m_ObjType] = pEnt->m_pNextTypeEntity;
	if(pEnt->m_pNextTypeEntity)
		pEnt->m_pNextTypeEntity->m_pPrevTypeEntity = pEnt->m_pPrevTypeEntity;

	// keep list traversing valid
	if(m_pNextTraverseEntity == pEnt)
		m_pNextTraverseEntity = pEnt->m_pNextTypeEntity;

	pEnt->m_pNextTypeEntity = 0;
	pEnt->m_pPrevTypeEntity = 0;
}